

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O3

void calc_var_all_cols<InputData<double,int>,WorkerMemory<ImputedData<int,double>,double,double>,double>
               (InputData<double,_int> *input_data,
               WorkerMemory<ImputedData<int,_double>,_double,_double> *workspace,
               ModelParams *model_params,double *variances,double *saved_xmin,double *saved_xmax,
               double *saved_means,double *saved_sds)

{
  size_t sVar1;
  ulong uVar2;
  int *Xc_indptr;
  pointer pdVar3;
  size_t *psVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar5;
  size_t sVar6;
  long lVar7;
  double *pdVar8;
  long lVar9;
  int iVar10;
  pointer buffer_cnt;
  pointer pdVar11;
  double dVar12;
  double xsd;
  double xmean;
  vector<double,_std::allocator<double>_> *local_68;
  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *local_60;
  vector<double,_std::allocator<double>_> *local_58;
  double *local_50;
  ColumnSampler<double> *local_48;
  ModelParams *local_40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_38;
  
  if (saved_means != (double *)0x0) {
    workspace->has_saved_stats = true;
  }
  local_48 = &workspace->col_sampler;
  local_50 = saved_xmax;
  ColumnSampler<double>::prepare_full_pass(local_48);
  sVar1 = (workspace->col_sampler).curr_pos;
  sVar6 = (workspace->col_sampler).curr_col;
  if (sVar1 != 0 && sVar1 != sVar6) {
    local_58 = &workspace->weights_arr;
    local_68 = &workspace->buffer_dbl;
    local_38 = &workspace->buffer_szt;
    local_60 = &workspace->weights_map;
    local_40 = model_params;
    do {
      pvVar5 = local_38;
      (workspace->col_sampler).last_given = sVar6;
      (workspace->col_sampler).curr_col = sVar6 + 1;
      uVar2 = (workspace->col_sampler).col_indices.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[sVar6];
      workspace->col_chosen = uVar2;
      lVar9 = uVar2 - input_data->ncols_numeric;
      if (uVar2 < input_data->ncols_numeric) {
        get_split_range<InputData<double,int>,WorkerMemory<ImputedData<int,double>,double,double>>
                  (workspace,input_data,model_params);
        if (workspace->unsplittable != true) {
          if (saved_xmin != (double *)0x0) {
            sVar1 = workspace->col_chosen;
            saved_xmin[sVar1] = workspace->xmin;
            local_50[sVar1] = workspace->xmax;
          }
          Xc_indptr = input_data->Xc_indptr;
          pdVar11 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar3 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if (Xc_indptr == (int *)0x0) {
            if (pdVar11 == pdVar3) {
              psVar4 = (workspace->ix_arr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((workspace->weights_map).m_ht.m_nb_elements == 0) {
                calc_mean_and_sd_t<double,double>
                          (psVar4,workspace->st,workspace->end,
                           input_data->numeric_data + input_data->nrows * workspace->col_chosen,
                           model_params->missing_action,&xsd,&xmean);
                goto LAB_00171cc3;
              }
              calc_mean_and_sd_weighted<double,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
                        (psVar4,workspace->st,workspace->end,
                         input_data->numeric_data + input_data->nrows * workspace->col_chosen,
                         local_60,model_params->missing_action,&xsd,&xmean);
            }
            else {
              calc_mean_and_sd_weighted<double,std::vector<double,std::allocator<double>>,double>
                        ((workspace->ix_arr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start,workspace->st,workspace->end,
                         input_data->numeric_data + input_data->nrows * workspace->col_chosen,
                         local_58,model_params->missing_action,&xsd,&xmean);
            }
          }
          else if (pdVar11 == pdVar3) {
            psVar4 = (workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((workspace->weights_map).m_ht.m_nb_elements == 0) {
              calc_mean_and_sd_<double,int,double>
                        (psVar4,workspace->st,workspace->end,workspace->col_chosen,input_data->Xc,
                         input_data->Xc_ind,Xc_indptr,&xsd,&xmean);
LAB_00171cc3:
              if (xsd <= 1e-10) {
                xsd = 1e-10;
              }
            }
            else {
              calc_mean_and_sd_weighted<double,int,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
                        (psVar4,workspace->st,workspace->end,workspace->col_chosen,input_data->Xc,
                         input_data->Xc_ind,Xc_indptr,&xsd,&xmean,local_60);
            }
          }
          else {
            calc_mean_and_sd_weighted<double,int,std::vector<double,std::allocator<double>>,double>
                      ((workspace->ix_arr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start,workspace->st,workspace->end,
                       workspace->col_chosen,input_data->Xc,input_data->Xc_ind,Xc_indptr,&xsd,&xmean
                       ,local_58);
          }
          if (saved_means != (double *)0x0) {
            saved_means[workspace->col_chosen] = xmean;
          }
          if (saved_sds != (double *)0x0) {
            saved_sds[workspace->col_chosen] = xsd;
          }
          goto LAB_00171d12;
        }
        ColumnSampler<double>::drop_col(local_48,workspace->col_chosen,0xffffffffffffffff);
        sVar1 = workspace->col_chosen;
        variances[sVar1] = 0.0;
        if (saved_xmin != (double *)0x0) {
          saved_xmin[sVar1] = 0.0;
          local_50[sVar1] = 0.0;
        }
      }
      else {
        if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          iVar10 = input_data->ncat[lVar9];
          lVar7 = (long)iVar10;
          uVar2 = lVar7 * 2;
          if ((workspace->weights_map).m_ht.m_nb_elements == 0) {
            buffer_cnt = (workspace->buffer_szt).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start;
            if ((ulong)((long)(workspace->buffer_szt).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)buffer_cnt >> 3) <=
                uVar2) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_38,uVar2 | 1)
              ;
              iVar10 = input_data->ncat[lVar9];
              buffer_cnt = (pvVar5->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start;
              lVar7 = (long)iVar10;
              model_params = local_40;
            }
            xsd = expected_sd_cat<unsigned_long,double>
                            ((workspace->ix_arr).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start,workspace->st,workspace->end,
                             input_data->categ_data + lVar9 * input_data->nrows,iVar10,
                             model_params->missing_action,buffer_cnt,buffer_cnt + lVar7 + 1,
                             (workspace->buffer_dbl).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start);
          }
          else {
            pdVar11 = (workspace->buffer_dbl).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(workspace->buffer_dbl).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pdVar11 >> 3) <= uVar2) {
              std::vector<double,_std::allocator<double>_>::resize(local_68,uVar2 | 1);
              iVar10 = input_data->ncat[lVar9];
              pdVar11 = (local_68->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              lVar7 = (long)iVar10;
            }
            xsd = expected_sd_cat_weighted<tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,unsigned_long,double>
                            ((workspace->ix_arr).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start,workspace->st,workspace->end,
                             input_data->categ_data + lVar9 * input_data->nrows,iVar10,
                             model_params->missing_action,local_60,pdVar11,
                             (workspace->buffer_szt).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start,pdVar11 + lVar7 + 1);
          }
        }
        else {
          pdVar8 = (workspace->buffer_dbl).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          iVar10 = input_data->ncat[lVar9];
          lVar7 = (long)iVar10;
          if ((ulong)((long)(workspace->buffer_dbl).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar8 >> 3) <=
              (ulong)(lVar7 * 2)) {
            std::vector<double,_std::allocator<double>_>::resize(local_68,lVar7 * 2 | 1);
            iVar10 = input_data->ncat[lVar9];
            pdVar8 = (local_68->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            lVar7 = (long)iVar10;
          }
          xsd = expected_sd_cat_weighted<std::vector<double,std::allocator<double>>,unsigned_long,double>
                          ((workspace->ix_arr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start,workspace->st,workspace->end,
                           input_data->categ_data + lVar9 * input_data->nrows,iVar10,
                           model_params->missing_action,local_58,pdVar8,
                           (workspace->buffer_szt).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start,pdVar8 + lVar7 + 1);
        }
LAB_00171d12:
        if ((xsd != 0.0) || (NAN(xsd))) {
          dVar12 = xsd * xsd;
          pdVar8 = workspace->tree_kurtoses;
          if ((pdVar8 != (double *)0x0) ||
             (pdVar8 = input_data->col_weights, pdVar8 != (double *)0x0)) {
            dVar12 = dVar12 * pdVar8[workspace->col_chosen];
          }
          if (dVar12 <= 1e-100) {
            dVar12 = 1e-100;
          }
          variances[workspace->col_chosen] = dVar12;
        }
        else {
          ColumnSampler<double>::drop_col(local_48,workspace->col_chosen,0xffffffffffffffff);
          variances[workspace->col_chosen] = 0.0;
        }
      }
      sVar1 = (workspace->col_sampler).curr_pos;
    } while ((sVar1 != 0) && (sVar6 = (workspace->col_sampler).curr_col, sVar1 != sVar6));
  }
  return;
}

Assistant:

void calc_var_all_cols(InputData &input_data, WorkerMemory &workspace, ModelParams &model_params,
                       double *restrict variances, double *restrict saved_xmin, double *restrict saved_xmax,
                       double *restrict saved_means, double *restrict saved_sds)
{
    double xmean, xsd;
    if (saved_means != NULL)
        workspace.has_saved_stats = true;

    workspace.col_sampler.prepare_full_pass();
    while (workspace.col_sampler.sample_col(workspace.col_chosen))
    {
        if (workspace.col_chosen < input_data.ncols_numeric)
        {
            get_split_range(workspace, input_data, model_params);
            if (workspace.unsplittable)
            {
                workspace.col_sampler.drop_col(workspace.col_chosen);
                variances[workspace.col_chosen] = 0;
                if (saved_xmin != NULL)
                {
                    saved_xmin[workspace.col_chosen] = 0;
                    saved_xmax[workspace.col_chosen] = 0;
                }
                continue;
            }

            if (saved_xmin != NULL)
            {
                saved_xmin[workspace.col_chosen] = workspace.xmin;
                saved_xmax[workspace.col_chosen] = workspace.xmax;
            }


            if (input_data.Xc_indptr == NULL)
            {
                if (workspace.weights_arr.empty() && workspace.weights_map.empty())
                {
                    calc_mean_and_sd<typename std::remove_pointer<decltype(input_data.numeric_data)>::type, ldouble_safe>(
                                     workspace.ix_arr.data(), workspace.st, workspace.end,
                                     input_data.numeric_data + workspace.col_chosen * input_data.nrows,
                                     model_params.missing_action, xsd, xmean);
                }

                else if (!workspace.weights_arr.empty())
                {
                    calc_mean_and_sd_weighted<typename std::remove_pointer<decltype(input_data.numeric_data)>::type,
                                              decltype(workspace.weights_arr), ldouble_safe>(
                                              workspace.ix_arr.data(), workspace.st, workspace.end,
                                              input_data.numeric_data + workspace.col_chosen * input_data.nrows,
                                              workspace.weights_arr,
                                              model_params.missing_action, xsd, xmean);
                }

                else
                {
                    calc_mean_and_sd_weighted<typename std::remove_pointer<decltype(input_data.numeric_data)>::type,
                                              decltype(workspace.weights_map), ldouble_safe>(
                                              workspace.ix_arr.data(), workspace.st, workspace.end,
                                              input_data.numeric_data + workspace.col_chosen * input_data.nrows,
                                              workspace.weights_map,
                                              model_params.missing_action, xsd, xmean);
                }
            }

            else
            {
                if (workspace.weights_arr.empty() && workspace.weights_map.empty())
                {
                    calc_mean_and_sd<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                     typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                     ldouble_safe>(
                                     workspace.ix_arr.data(), workspace.st, workspace.end,
                                     workspace.col_chosen,
                                     input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                     xsd, xmean);
                }

                else if (!workspace.weights_arr.empty())
                {
                    calc_mean_and_sd_weighted<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                              typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                              decltype(workspace.weights_arr), ldouble_safe>(
                                              workspace.ix_arr.data(), workspace.st, workspace.end,
                                              workspace.col_chosen,
                                              input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                              xsd, xmean, workspace.weights_arr);
                }

                else
                {
                    calc_mean_and_sd_weighted<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                              typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                              decltype(workspace.weights_map), ldouble_safe>(
                                              workspace.ix_arr.data(), workspace.st, workspace.end,
                                              workspace.col_chosen,
                                              input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                              xsd, xmean, workspace.weights_map);
                }
            }

            if (saved_means != NULL) saved_means[workspace.col_chosen] = xmean;
            if (saved_sds != NULL) saved_sds[workspace.col_chosen] = xsd;
        }

        else
        {
            size_t col = workspace.col_chosen - input_data.ncols_numeric;
            if (workspace.weights_arr.empty() && workspace.weights_map.empty())
            {
                if (workspace.buffer_szt.size() < (size_t)2 * (size_t)input_data.ncat[col] + 1)
                    workspace.buffer_szt.resize((size_t)2 * (size_t)input_data.ncat[col] + 1);
                xsd = expected_sd_cat<size_t, ldouble_safe>(
                                      workspace.ix_arr.data(), workspace.st, workspace.end,
                                      input_data.categ_data + col * input_data.nrows,
                                      input_data.ncat[col],
                                      model_params.missing_action,
                                      workspace.buffer_szt.data(),
                                      workspace.buffer_szt.data() + input_data.ncat[col] + 1,
                                      workspace.buffer_dbl.data());
            }

            else if (!workspace.weights_arr.empty())
            {
                if (workspace.buffer_dbl.size() < (size_t)2 * (size_t)input_data.ncat[col] + 1)
                    workspace.buffer_dbl.resize((size_t)2 * (size_t)input_data.ncat[col] + 1);
                xsd = expected_sd_cat_weighted<decltype(workspace.weights_arr), size_t, ldouble_safe>(
                                               workspace.ix_arr.data(), workspace.st, workspace.end,
                                               input_data.categ_data + col * input_data.nrows,
                                               input_data.ncat[col],
                                               model_params.missing_action, workspace.weights_arr,
                                               workspace.buffer_dbl.data(),
                                               workspace.buffer_szt.data(),
                                               workspace.buffer_dbl.data() + input_data.ncat[col] + 1);
            }

            else
            {
                if (workspace.buffer_dbl.size() < (size_t)2 * (size_t)input_data.ncat[col] + 1)
                    workspace.buffer_dbl.resize((size_t)2 * (size_t)input_data.ncat[col] + 1);
                xsd = expected_sd_cat_weighted<decltype(workspace.weights_map), size_t, ldouble_safe>(
                                               workspace.ix_arr.data(), workspace.st, workspace.end,
                                               input_data.categ_data + col * input_data.nrows,
                                               input_data.ncat[col],
                                               model_params.missing_action, workspace.weights_map,
                                               workspace.buffer_dbl.data(),
                                               workspace.buffer_szt.data(),
                                               workspace.buffer_dbl.data() + input_data.ncat[col] + 1);
            }
        }

        if (xsd)
        {
            variances[workspace.col_chosen] = square(xsd);
            if (workspace.tree_kurtoses != NULL)
                variances[workspace.col_chosen] *= workspace.tree_kurtoses[workspace.col_chosen];
            else if (input_data.col_weights != NULL)
                variances[workspace.col_chosen] *= input_data.col_weights[workspace.col_chosen];
            variances[workspace.col_chosen] = std::fmax(variances[workspace.col_chosen], 1e-100);
        }

        else
        {
            workspace.col_sampler.drop_col(workspace.col_chosen);
            variances[workspace.col_chosen] = 0;
        }
    }
}